

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O3

void absl::anon_unknown_0::AppendNumberUnit(string *out,double n,DisplayUnit unit)

{
  char cVar1;
  string *this;
  char *pcVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  char *pcVar10;
  size_type __n;
  long lVar11;
  double dVar12;
  char local_4a [2];
  undefined8 local_48;
  string *local_40;
  double local_38;
  
  iVar6 = 0xf;
  if (unit.prec < 0xf) {
    iVar6 = unit.prec;
  }
  local_38 = 0.0;
  dVar12 = modf(n,&local_38);
  dVar12 = dVar12 * unit.pow10;
  if (0.0 <= dVar12) {
    dVar12 = floor(dVar12 + 0.5);
  }
  else {
    dVar12 = ceil(dVar12 + -0.5);
  }
  lVar11 = (long)dVar12;
  if ((long)local_38 != 0 || lVar11 != 0) {
    uVar9 = 0xffffffff;
    lVar5 = (long)local_38;
    uVar8 = 0;
    do {
      uVar7 = uVar8;
      local_4a[uVar7 + 1] = (char)lVar5 + (char)(lVar5 / 10) * -10 + '0';
      uVar3 = lVar5 + 9;
      uVar8 = uVar7 - 1;
      uVar9 = uVar9 - 1;
      lVar5 = lVar5 / 10;
    } while (0x12 < uVar3);
    local_48 = (long)unit.prec;
    local_40 = out;
    if ((int)uVar8 + 1 < 2) {
      pcVar10 = local_4a + uVar7 + 1;
    }
    else {
      pcVar10 = local_4a + (uVar8 - uVar9) + 1;
      memset(pcVar10,0x30,uVar8 & 0xffffffff);
    }
    this = local_40;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (local_40,pcVar10,(long)&local_48 - (long)pcVar10);
    if (lVar11 != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (this,'.');
      uVar9 = iVar6 - 1;
      lVar5 = 0;
      do {
        lVar4 = lVar5;
        local_4a[lVar4 + 1] = (char)lVar11 + (char)(lVar11 / 10) * -10 + '0';
        uVar8 = lVar11 + 9;
        lVar5 = lVar4 + -1;
        uVar9 = uVar9 - 1;
        lVar11 = lVar11 / 10;
      } while (0x12 < uVar8);
      lVar11 = 0xf;
      if (local_48 < 0xf) {
        lVar11 = local_48;
      }
      if ((int)(lVar11 + lVar5) + 1 < 2) {
        pcVar10 = local_4a + lVar4 + 1;
      }
      else {
        pcVar10 = local_4a + (lVar5 - (ulong)uVar9) + 1;
        memset(pcVar10,0x30,lVar11 + lVar5 & 0xffffffff);
      }
      __n = (long)&local_48 + (1 - (long)pcVar10);
      pcVar2 = local_4a + 1;
      do {
        __n = __n - 1;
        cVar1 = *pcVar2;
        pcVar2 = pcVar2 + -1;
      } while (cVar1 == '0');
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (this,pcVar10,__n);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (this,unit.abbr._M_str,unit.abbr._M_len);
  }
  return;
}

Assistant:

void AppendNumberUnit(std::string* out, double n, DisplayUnit unit) {
  constexpr int kBufferSize = std::numeric_limits<double>::digits10;
  const int prec = std::min(kBufferSize, unit.prec);
  char buf[kBufferSize];  // also large enough to hold integer part
  char* ep = buf + sizeof(buf);
  double d = 0;
  int64_t frac_part = Round(std::modf(n, &d) * unit.pow10);
  int64_t int_part = d;
  if (int_part != 0 || frac_part != 0) {
    char* bp = Format64(ep, 0, int_part);  // always < 1000
    out->append(bp, ep - bp);
    if (frac_part != 0) {
      out->push_back('.');
      bp = Format64(ep, prec, frac_part);
      while (ep[-1] == '0') --ep;
      out->append(bp, ep - bp);
    }
    out->append(unit.abbr.data(), unit.abbr.size());
  }
}